

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cpp
# Opt level: O0

bool __thiscall
Clasp::ClaspStatistics::removeStat(ClaspStatistics *this,StatisticObject *obj,bool recurse)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  Type TVar4;
  byte in_DL;
  ClaspStatistics *in_RSI;
  StatisticObject *in_RDI;
  uint32 end_1;
  uint32 i_1;
  uint32 end;
  uint32 i;
  bool ret;
  StatisticObject *in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  StatisticObject *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  uint32 local_30;
  Statistics_t local_2c;
  uint64 local_28;
  uint32 local_20;
  undefined4 in_stack_ffffffffffffffe4;
  uint32 uVar5;
  undefined2 in_stack_ffffffffffffffec;
  
  bVar1 = in_DL & 1;
  uVar3 = Impl::remove((Impl *)in_RDI[1].handle_,(char *)in_RSI);
  bVar2 = (byte)uVar3 & 1;
  if (((uVar3 & 1) != 0) && ((bVar1 & 1) != 0)) {
    TVar4 = StatisticObject::type(in_stack_ffffffffffffffa8);
    uVar3 = Potassco::Statistics_t::operator_cast_to_unsigned_int
                      ((Statistics_t *)&stack0xffffffffffffffe8);
    if (uVar3 == 3) {
      uVar5 = 0;
      local_20 = StatisticObject::size
                           ((StatisticObject *)
                            CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      for (; uVar5 != local_20; uVar5 = uVar5 + 1) {
        StatisticObject::key(in_stack_ffffffffffffffc0,(uint32)((ulong)in_RDI >> 0x20));
        local_28 = (uint64)StatisticObject::at((StatisticObject *)
                                               CONCAT44(in_stack_ffffffffffffffcc,
                                                        in_stack_ffffffffffffffc8),
                                               (char *)in_stack_ffffffffffffffc0);
        removeStat(in_RSI,(StatisticObject *)
                          CONCAT17(bVar1,CONCAT16(bVar2,CONCAT24(in_stack_ffffffffffffffec,
                                                                 TVar4.val_))),
                   SUB41(uVar5 >> 0x18,0));
      }
    }
    else {
      local_2c.val_ = (E)StatisticObject::type(in_stack_ffffffffffffffa8);
      uVar3 = Potassco::Statistics_t::operator_cast_to_unsigned_int(&local_2c);
      if (uVar3 == 2) {
        local_30 = 0;
        uVar5 = StatisticObject::size
                          ((StatisticObject *)
                           CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
        for (; local_30 != uVar5; local_30 = local_30 + 1) {
          StatisticObject::operator[](in_RDI,(uint32)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
          removeStat(in_RSI,(StatisticObject *)
                            CONCAT17(bVar1,CONCAT16(bVar2,CONCAT24(in_stack_ffffffffffffffec,
                                                                   TVar4.val_))),
                     SUB41((uint)in_stack_ffffffffffffffe4 >> 0x18,0));
        }
      }
    }
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool ClaspStatistics::removeStat(const StatisticObject& obj, bool recurse) {
	bool ret = impl_->remove(obj);
	if (ret && recurse) {
		if (obj.type() == Potassco::Statistics_t::Map) {
			for (uint32 i = 0, end = obj.size(); i != end; ++i) {
				removeStat(obj.at(obj.key(i)), true);
			}
		}
		else if (obj.type() == Potassco::Statistics_t::Array) {
			for (uint32 i = 0, end = obj.size(); i != end; ++i) {
				removeStat(obj[i], true);
			}
		}
	}
	return ret;
}